

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

int64_t Fixpp::impl::details::
        IndexesImpl<meta::pack::Pack<Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>
        ::of_binary_search(int tag)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = 1;
  lVar1 = 0;
  while( true ) {
    lVar4 = lVar1;
    if (lVar3 < lVar4) {
      return -1;
    }
    lVar2 = (lVar3 + lVar4) / 2;
    if (Sorted.arr[lVar2] == tag) break;
    lVar1 = lVar2 + 1;
    if (tag <= Sorted.arr[lVar2]) {
      lVar3 = lVar2 + -1;
      lVar1 = lVar4;
    }
  }
  return lVar2;
}

Assistant:

static int64_t of_binary_search(int tag)
                {
                    int64_t low = 0;
                    int64_t high = Size - 1;
                    while (low <= high) {
                       auto mid = (low + high) / 2;
                       if (Sorted[mid] == tag) return mid;
                       else if (Sorted[mid] < tag) low = mid + 1;
                       else high = mid - 1;
                    }
                    return -1;
                }